

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O3

void __thiscall CVmConstMapper::prepare_to_store_data(CVmConstMapper *this)

{
  ulong uVar1;
  vm_const_mapper_page **ppvVar2;
  vm_const_mapper_page *pvVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = this->page_size_;
  uVar4 = ~this->base_addr_ + this->next_free_ + uVar5;
  uVar1 = uVar4 / uVar5;
  this->pages_cnt_ = uVar1;
  ppvVar2 = (vm_const_mapper_page **)malloc(uVar1 * 8);
  this->pages_ = ppvVar2;
  if (ppvVar2 != (vm_const_mapper_page **)0x0) {
    if (uVar5 <= uVar4) {
      uVar5 = 0;
      do {
        pvVar3 = (vm_const_mapper_page *)malloc(this->page_size_ + 8);
        this->pages_[uVar5] = pvVar3;
        if (this->pages_[uVar5] == (vm_const_mapper_page *)0x0) goto LAB_001e3747;
        this->pages_[uVar5]->max_ofs_used = 0;
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->pages_cnt_);
    }
    return;
  }
LAB_001e3747:
  err_throw(0xca);
}

Assistant:

void CVmConstMapper::prepare_to_store_data()
{
    size_t i;
    
    /* figure out how many pages we need */
    pages_cnt_ = calc_page_count();

    /* allocate space for the list of pages */
    pages_ = (vm_const_mapper_page **)
             t3malloc(pages_cnt_ * sizeof(pages_[0]));
    if (pages_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* allocate each page */
    for (i = 0 ; i < pages_cnt_ ; ++i)
    {
        /* 
         *   allocate this page - allocate the header structure plus space
         *   for the page data 
         */
        pages_[i] = (vm_const_mapper_page *)
                    t3malloc(sizeof(pages_[i]) + page_size_);
        if (pages_[i] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* the page has nothing stored yet */
        pages_[i]->max_ofs_used = 0;
    }
}